

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decodeISE
               (ISEDecodedResult *dst,int numValues,BitAccessStream *data,ISEParams *params)

{
  deInt32 dVar1;
  int local_4c;
  int local_48;
  int local_44;
  int i;
  int numValuesInBlock_1;
  int blockNdx_1;
  int numBlocks_1;
  int numValuesInBlock;
  int blockNdx;
  int numBlocks;
  ISEParams *params_local;
  BitAccessStream *data_local;
  int numValues_local;
  ISEDecodedResult *dst_local;
  
  if (params->mode == ISEMODE_TRIT) {
    dVar1 = deDivRoundUp32(numValues,5);
    for (numBlocks_1 = 0; numBlocks_1 < dVar1; numBlocks_1 = numBlocks_1 + 1) {
      if (numBlocks_1 == dVar1 + -1) {
        local_48 = numValues + (dVar1 + -1) * -5;
      }
      else {
        local_48 = 5;
      }
      decodeISETritBlock(dst + numBlocks_1 * 5,local_48,data,params->numBits);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    dVar1 = deDivRoundUp32(numValues,3);
    for (i = 0; i < dVar1; i = i + 1) {
      if (i == dVar1 + -1) {
        local_4c = numValues + (dVar1 + -1) * -3;
      }
      else {
        local_4c = 3;
      }
      decodeISEQuintBlock(dst + i * 3,local_4c,data,params->numBits);
    }
  }
  else {
    for (local_44 = 0; local_44 < numValues; local_44 = local_44 + 1) {
      decodeISEBitBlock(dst + local_44,data,params->numBits);
    }
  }
  return;
}

Assistant:

void decodeISE (ISEDecodedResult* dst, int numValues, BitAccessStream& data, const ISEParams& params)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			decodeISETritBlock(&dst[5*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			decodeISEQuintBlock(&dst[3*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			decodeISEBitBlock(&dst[i], data, params.numBits);
	}
}